

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_traits.hpp
# Opt level: O3

void jsoncons::detail::
     json_serialize_tuple_helper<2UL,_2UL,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
     ::encode(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *tuple,basic_json_visitor<char> *encoder,
             basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *proto,error_code *ec)

{
  undefined **local_38;
  undefined **local_30;
  pointer local_28;
  
  local_28 = (tuple->
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             ).
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             ._M_head_impl._M_dataplus._M_p;
  local_30 = (undefined **)
             (tuple->
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             ).
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             ._M_head_impl._M_string_length;
  local_38 = &PTR__ser_context_00b2f9c8;
  (*encoder->_vptr_basic_json_visitor[0xc])(encoder,&local_30,0,&local_38,ec);
  if (ec->_M_value == 0) {
    local_30 = &PTR__ser_context_00b2f9c8;
    (*encoder->_vptr_basic_json_visitor[0x10])
              (encoder,(long)(tuple->
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                             ).super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>.
                             _M_head_impl,0,&local_30,ec);
  }
  return;
}

Assistant:

static void encode(const Tuple& tuple,
                               basic_json_visitor<char_type>& encoder, 
                               const Json& proto, 
                               std::error_code& ec)
            {
                encode_traits<element_type,char_type>::encode(std::get<Size-Pos>(tuple), encoder, proto, ec);
                if (JSONCONS_UNLIKELY(ec)) {return;}
                next::encode(tuple, encoder, proto, ec);
            }